

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.hh
# Opt level: O0

bool OB::Color::valid(string *k)

{
  string *psVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  bool local_81;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_80;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_78;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_70;
  byte local_39;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_38;
  byte local_11;
  string *psStack_10;
  bool valid;
  string *k_local;
  
  local_11 = 0;
  psStack_10 = k;
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    bVar2 = std::operator==(psStack_10,"clear");
    if (bVar2) {
      local_11 = 1;
    }
    else {
      bVar2 = std::operator==(psStack_10,"reverse");
      if (bVar2) {
        local_11 = 1;
      }
      else {
        bVar2 = std::operator==(psStack_10,"rainbow");
        if (((bVar2) || (bVar2 = std::operator==(psStack_10,"candy"), bVar2)) ||
           (bVar2 = std::operator==(psStack_10,"party"), bVar2)) {
          local_11 = 1;
        }
        else {
          pcVar6 = (char *)std::__cxx11::string::at((ulong)psStack_10);
          psVar1 = psStack_10;
          local_39 = 0;
          local_81 = false;
          if (*pcVar6 == '#') {
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                      (&local_38,"^#[0-9a-fA-F]{3}(?:[0-9a-fA-F]{3})?$",0x10);
            local_39 = 1;
            local_81 = String::assert_rx(psVar1,&local_38);
          }
          if ((local_39 & 1) != 0) {
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                      (&local_38);
          }
          psVar1 = psStack_10;
          if (local_81 == false) {
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                      (&local_70,"^[0-9]{1,3}$",0x10);
            bVar3 = String::assert_rx(psVar1,&local_70);
            bVar2 = false;
            if (bVar3) {
              iVar4 = std::__cxx11::stoi(psStack_10,(size_t *)0x0,10);
              bVar2 = false;
              if (-1 < iVar4) {
                iVar4 = std::__cxx11::stoi(psStack_10,(size_t *)0x0,10);
                bVar2 = iVar4 < 0x100;
              }
            }
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                      (&local_70);
            if (bVar2) {
              local_11 = 1;
            }
            else {
              local_78._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&color_fg_abi_cxx11_,psStack_10);
              local_80._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end(&color_fg_abi_cxx11_);
              bVar2 = std::__detail::operator!=(&local_78,&local_80);
              if (bVar2) {
                local_11 = 1;
              }
            }
          }
          else {
            local_11 = 1;
          }
        }
      }
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

static bool valid(std::string const& k)
  {
    bool valid {false};

    if (! k.empty())
    {
      if (k == "clear")
      {
        valid = true;
      }
      else if (k == "reverse")
      {
        valid = true;
      }
      else if (k == "rainbow" || k == "candy" || k == "party")
      {
        valid = true;
      }
      else
      {
        // 24-bit color
        if (k.at(0) == '#' && OB::String::assert_rx(k,
          std::regex("^#[0-9a-fA-F]{3}(?:[0-9a-fA-F]{3})?$")))
        {
          valid = true;
        }

        // 8-bit color
        else if (OB::String::assert_rx(k, std::regex("^[0-9]{1,3}$")) &&
          std::stoi(k) >= 0 && std::stoi(k) <= 255)
        {
          valid = true;
        }

        // 4-bit color
        else if (color_fg.find(k) != color_fg.end())
        {
          valid = true;
        }
      }
    }

    return valid;
  }